

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall duckdb::Executor::WorkOnTasks(Executor *this)

{
  bool bVar1;
  int iVar2;
  TaskScheduler *this_00;
  type token;
  Task *pTVar3;
  shared_ptr<duckdb::Task,_true> task_from_producer;
  __shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = TaskScheduler::GetScheduler(this->context);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    token = unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true>::
            operator*(&this->producer);
    bVar1 = TaskScheduler::GetTaskFromProducer
                      (this_00,token,(shared_ptr<duckdb::Task,_true> *)&local_28);
    if (!bVar1) break;
    pTVar3 = shared_ptr<duckdb::Task,_true>::operator->((shared_ptr<duckdb::Task,_true> *)&local_28)
    ;
    iVar2 = (*pTVar3->_vptr_Task[2])(pTVar3,0);
    if ((char)iVar2 == '\x03') {
      pTVar3 = shared_ptr<duckdb::Task,_true>::operator->
                         ((shared_ptr<duckdb::Task,_true> *)&local_28);
      (*pTVar3->_vptr_Task[3])(pTVar3);
    }
    ::std::__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>::reset(&local_28);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void Executor::WorkOnTasks() {
	auto &scheduler = TaskScheduler::GetScheduler(context);

	shared_ptr<Task> task_from_producer;
	while (scheduler.GetTaskFromProducer(*producer, task_from_producer)) {
		auto res = task_from_producer->Execute(TaskExecutionMode::PROCESS_ALL);
		if (res == TaskExecutionResult::TASK_BLOCKED) {
			task_from_producer->Deschedule();
		}
		task_from_producer.reset();
	}
}